

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::emplace<OrderedScreen>
          (QGenericArrayOps<OrderedScreen> *this,qsizetype i,OrderedScreen *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  OrderedScreen *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  OrderedScreen tmp;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8e;
  byte bVar6;
  OrderedScreen *this_00;
  Inserter local_158;
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<OrderedScreen>::needsDetach((QArrayDataPointer<OrderedScreen> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == *(long *)&(in_RDI->vinfo).virtualPos.yp) &&
       (qVar3 = QArrayDataPointer<OrderedScreen>::freeSpaceAtEnd
                          ((QArrayDataPointer<OrderedScreen> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe8e,
                                                   CONCAT24(in_stack_fffffffffffffe8c,
                                                            in_stack_fffffffffffffe88)))),
       qVar3 != 0)) {
      QArrayDataPointer<OrderedScreen>::end((QArrayDataPointer<OrderedScreen> *)in_RDI);
      OrderedScreen::OrderedScreen
                (in_RDI,(OrderedScreen *)
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      *(long *)&(in_RDI->vinfo).virtualPos.yp = *(long *)&(in_RDI->vinfo).virtualPos.yp + 1;
      goto LAB_00170460;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<OrderedScreen>::freeSpaceAtBegin
                          ((QArrayDataPointer<OrderedScreen> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe8e,
                                                   CONCAT24(in_stack_fffffffffffffe8c,
                                                            in_stack_fffffffffffffe88)))),
       qVar3 != 0)) {
      QArrayDataPointer<OrderedScreen>::begin((QArrayDataPointer<OrderedScreen> *)0x17031a);
      OrderedScreen::OrderedScreen
                (in_RDI,(OrderedScreen *)
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      *(long *)&in_RDI->vinfo = *(long *)&in_RDI->vinfo + -0x100;
      *(long *)&(in_RDI->vinfo).virtualPos.yp = *(long *)&(in_RDI->vinfo).virtualPos.yp + 1;
      goto LAB_00170460;
    }
  }
  memcpy(local_108,&DAT_00186d00,0x100);
  OrderedScreen::OrderedScreen
            (in_RDI,(OrderedScreen *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  bVar4 = *(long *)&(in_RDI->vinfo).virtualPos.yp != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<OrderedScreen>::detachAndGrow
            ((QArrayDataPointer<OrderedScreen> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (OrderedScreen **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffe8c,uVar2))),
             (QArrayDataPointer<OrderedScreen> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_158,(QArrayDataPointer<OrderedScreen> *)in_RDI);
    Inserter::insertOne(in_RDX,CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffe8c,
                                                                      uVar2))),in_RDI);
    Inserter::~Inserter(&local_158);
  }
  else {
    QArrayDataPointer<OrderedScreen>::begin((QArrayDataPointer<OrderedScreen> *)0x1703ea);
    OrderedScreen::OrderedScreen(in_RDI,(OrderedScreen *)CONCAT17(uVar5,in_stack_fffffffffffffe78));
    *(long *)&in_RDI->vinfo = *(long *)&in_RDI->vinfo + -0x100;
    *(long *)&(in_RDI->vinfo).virtualPos.yp = *(long *)&(in_RDI->vinfo).virtualPos.yp + 1;
  }
  OrderedScreen::~OrderedScreen((OrderedScreen *)0x170460);
LAB_00170460:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }